

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

ListNode * list_add(ListNode *head,ListNode *new_node)

{
  ListNode *pLVar1;
  
  _assert_true((unsigned_long)head,"head",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x26e);
  _assert_true((unsigned_long)new_node,"new_node",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x26f);
  new_node->next = head;
  pLVar1 = head->prev;
  new_node->prev = pLVar1;
  pLVar1->next = new_node;
  head->prev = new_node;
  return new_node;
}

Assistant:

static ListNode* list_add(ListNode * const head, ListNode *new_node) {
    assert_non_null(head);
    assert_non_null(new_node);
    new_node->next = head;
    new_node->prev = head->prev;
    head->prev->next = new_node;
    head->prev = new_node;
    return new_node;
}